

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,int value)

{
  ostream *poVar1;
  void *this_00;
  int iVar2;
  ostringstream local_190 [8];
  ostringstream oss;
  int value_local;
  
  iVar2 = (int)this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,iVar2);
  if (0xff < iVar2) {
    poVar1 = std::operator<<((ostream *)local_190," (0x");
    this_00 = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(this_00,iVar2);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( int value ) {
    std::ostringstream oss;
    oss << value;
    if( value > Detail::hexThreshold )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}